

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRasterizationTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::rasterization::anon_unknown_0::FillRuleTestInstance::iterate
          (TestStatus *__return_storage_ptr__,FillRuleTestInstance *this)

{
  ostringstream *poVar1;
  deUint32 width;
  FillRuleCaseType FVar2;
  uint uVar3;
  TestLog *pTVar4;
  FillRuleTestInstance *pFVar5;
  long *plVar6;
  undefined8 *puVar7;
  long lVar8;
  size_type *psVar9;
  ulong *puVar10;
  Surface *surface;
  void *__buf;
  int iVar11;
  long lVar12;
  int iVar13;
  undefined8 uVar14;
  bool bVar15;
  int iVar16;
  int row;
  ulong uVar17;
  long lVar18;
  long lVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> drawBuffer;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> colorBuffer;
  Surface resultImage;
  string iterationDescription;
  ScopedLogSection section;
  IVec4 colorBits;
  Random rnd;
  float local_344;
  float local_340;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_338;
  float local_320;
  float local_31c;
  float local_318;
  float local_314;
  float local_310;
  int local_30c;
  int local_308;
  int local_304;
  string local_300;
  string local_2e0;
  FillRuleTestInstance *local_2c0;
  float local_2b8;
  float local_2b4;
  float local_2b0;
  float local_2ac;
  LogImageSet local_2a8;
  string local_268;
  Surface local_248;
  string local_230;
  ulong local_210;
  ScopedLogSection local_208;
  TestStatus *local_200;
  long local_1f8;
  long local_1f0;
  tcu local_1e8 [4];
  char local_1e4;
  char local_1e0;
  string local_1d8;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  _Alloc_hider local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188 [4];
  ios_base local_148 [8];
  ios_base local_140 [272];
  
  iVar11 = this->m_iteration;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
  std::ostream::operator<<((ostringstream *)local_1b8,iVar11 + 1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
  std::ios_base::~ios_base(local_148);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_268,0,(char *)0x0,0xb21970);
  psVar9 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_2e0.field_2._M_allocated_capacity = *psVar9;
    local_2e0.field_2._8_8_ = plVar6[3];
    local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
  }
  else {
    local_2e0.field_2._M_allocated_capacity = *psVar9;
    local_2e0._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_2e0._M_string_length = plVar6[1];
  *plVar6 = (long)psVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_2e0);
  local_2a8.m_name._M_dataplus._M_p = (pointer)&local_2a8.m_name.field_2;
  puVar10 = (ulong *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar10) {
    local_2a8.m_name.field_2._M_allocated_capacity = *puVar10;
    local_2a8.m_name.field_2._8_8_ = plVar6[3];
  }
  else {
    local_2a8.m_name.field_2._M_allocated_capacity = *puVar10;
    local_2a8.m_name._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_2a8.m_name._M_string_length = plVar6[1];
  *plVar6 = (long)puVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
  std::ostream::operator<<(local_1b8,this->m_iterationCount);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
  std::ios_base::~ios_base(local_148);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8.m_name._M_dataplus._M_p != &local_2a8.m_name.field_2) {
    uVar14 = local_2a8.m_name.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_2a8.m_name._M_string_length + local_300._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != &local_300.field_2) {
      uVar14 = local_300.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_2a8.m_name._M_string_length + local_300._M_string_length)
    goto LAB_0079eacd;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_300,0,(char *)0x0,(ulong)local_2a8.m_name._M_dataplus._M_p);
  }
  else {
LAB_0079eacd:
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_2a8,(ulong)local_300._M_dataplus._M_p);
  }
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  psVar9 = puVar7 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_230.field_2._M_allocated_capacity = *psVar9;
    local_230.field_2._8_8_ = puVar7[3];
  }
  else {
    local_230.field_2._M_allocated_capacity = *psVar9;
    local_230._M_dataplus._M_p = (pointer)*puVar7;
  }
  local_230._M_string_length = puVar7[1];
  *puVar7 = psVar9;
  puVar7[1] = 0;
  *(undefined1 *)psVar9 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != &local_300.field_2) {
    operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8.m_name._M_dataplus._M_p != &local_2a8.m_name.field_2) {
    operator_delete(local_2a8.m_name._M_dataplus._M_p,
                    local_2a8.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  tcu::ScopedLogSection::ScopedLogSection
            (&local_208,
             ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context)->m_testCtx->
             m_log,&local_230,&local_230);
  tcu::getTextureFormatBitDepth(local_1e8,&(this->super_BaseRenderingTestInstance).m_textureFormat);
  iVar11 = 1 << (8U - (char)local_1e8[0] & 0x1f);
  local_304 = 1 << (8U - local_1e4 & 0x1f);
  local_308 = 1 << (8U - local_1e0 & 0x1f);
  width = (this->super_BaseRenderingTestInstance).m_renderSize;
  tcu::Surface::Surface(&local_248,width,width);
  local_338.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_338.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_338.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  FVar2 = this->m_caseType;
  local_30c = iVar11;
  local_2c0 = this;
  if (FVar2 < FILLRULECASE_LAST) {
    iVar11 = this->m_iteration;
    if ((0x13U >> (FVar2 & 0x1f) & 1) == 0) {
      fVar20 = ((float)iVar11 / (float)(this->m_iterationCount + -1)) * 3.1415927 * 0.5;
      fVar22 = cosf(fVar20);
      fVar20 = sinf(fVar20);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
                (&local_338,6);
      if (FVar2 == FILLRULECASE_CLIPPED_PARTIAL) {
        fVar26 = 0.5;
      }
      else {
        fVar26 = 0.0;
      }
      fVar20 = fVar20 * *(float *)(&DAT_00b20f0c +
                                  (ulong)(FVar2 == FILLRULECASE_CLIPPED_PARTIAL) * 4);
      fVar22 = fVar22 * *(float *)(&DAT_00b20f0c +
                                  (ulong)(FVar2 == FILLRULECASE_CLIPPED_PARTIAL) * 4);
      fVar24 = fVar22 + (fVar26 - fVar20);
      fVar23 = (fVar26 - fVar22) - fVar20;
      fVar25 = (fVar26 + fVar20) - fVar22;
      fVar21 = fVar26 + fVar22 + fVar20;
      (local_338.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
       _M_impl.super__Vector_impl_data._M_start)->m_data[0] = fVar21;
      (local_338.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
       _M_impl.super__Vector_impl_data._M_start)->m_data[1] = fVar25;
      (local_338.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
       _M_impl.super__Vector_impl_data._M_start)->m_data[2] = 0.0;
      (local_338.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
       _M_impl.super__Vector_impl_data._M_start)->m_data[3] = 1.0;
      local_338.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[1].m_data[0] = (fVar26 + fVar22) - fVar20;
      local_338.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[1].m_data[1] = fVar22 + fVar26 + fVar20;
      local_338.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[1].m_data[2] = 0.0;
      local_338.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[1].m_data[3] = 1.0;
      local_338.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[2].m_data[0] = fVar23;
      local_338.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[2].m_data[1] = fVar24;
      local_338.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[2].m_data[2] = 0.0;
      local_338.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[2].m_data[3] = 1.0;
      local_338.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[3].m_data[0] = fVar23;
      local_338.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[3].m_data[1] = fVar24;
      local_338.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[3].m_data[2] = 0.0;
      local_338.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[3].m_data[3] = 1.0;
      local_338.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[4].m_data[0] = fVar21;
      local_338.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[4].m_data[1] = fVar25;
      local_338.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[4].m_data[2] = 0.0;
      local_338.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[4].m_data[3] = 1.0;
      local_338.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[5].m_data[0] = fVar20 + (fVar26 - fVar22);
      local_338.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[5].m_data[1] = (fVar26 - fVar20) - fVar22;
      local_338.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[5].m_data[2] = 0.0;
      local_338.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[5].m_data[3] = 1.0;
    }
    else {
      deRandom_init((deRandom *)local_1b8,0xabcd);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
                (&local_338,0x60);
      iVar11 = iVar11 << 4;
      lVar12 = 0;
      lVar19 = 0;
      lVar8 = 0;
      local_200 = __return_storage_ptr__;
      do {
        fVar20 = ((float)(int)lVar8 + 0.5) * 0.25;
        local_2ac = fVar20 + fVar20 + -1.0;
        local_210 = lVar8 * 4;
        lVar18 = 0;
        uVar17 = 0;
        local_1f8 = lVar8;
        local_1f0 = lVar19;
        do {
          pFVar5 = local_2c0;
          fVar20 = ((float)(int)uVar17 + 0.5) * 0.25;
          local_344 = fVar20 + fVar20 + -1.0;
          fVar20 = ((float)(iVar11 + (int)uVar17) / (float)(local_2c0->m_iterationCount << 4)) *
                   3.1415927 * 0.5;
          local_340 = cosf(fVar20);
          fVar20 = sinf(fVar20);
          local_340 = local_340 * 0.15;
          fVar20 = fVar20 * 0.15;
          local_31c = local_340 + local_344;
          local_310 = fVar20 + local_31c;
          local_31c = local_31c - fVar20;
          local_320 = local_340 + local_2ac + fVar20;
          fVar22 = (local_2ac + fVar20) - local_340;
          local_344 = local_344 - local_340;
          local_318 = local_344 - fVar20;
          local_314 = local_340 + (local_2ac - fVar20);
          local_344 = local_344 + fVar20;
          local_340 = (local_2ac - fVar20) - local_340;
          FVar2 = pFVar5->m_caseType;
          if (FVar2 == FILLRULECASE_PROJECTED) {
            fVar20 = deRandom_getFloat((deRandom *)local_1b8);
            local_2b0 = fVar20 * 3.9 + 0.1;
            fVar20 = deRandom_getFloat((deRandom *)local_1b8);
            local_2b8 = fVar20 * 3.9 + 0.1;
            local_2b4 = deRandom_getFloat((deRandom *)local_1b8);
            fVar20 = deRandom_getFloat((deRandom *)local_1b8);
            fVar26 = local_2b4 * 3.9 + 0.1;
            fVar20 = fVar20 * 3.9 + 0.1;
            lVar8 = (uVar17 | local_210) * 6;
            *(float *)((long)(local_338.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar18 + lVar12)
                 = local_310 * local_2b0;
            *(float *)((long)(local_338.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_data +
                      lVar18 + 4 + lVar12) = fVar22 * local_2b0;
            *(undefined4 *)
             ((long)(local_338.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar18 + 8 + lVar12) = 0;
            *(float *)((long)(local_338.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_data +
                      lVar18 + 0xc + lVar12) = local_2b0;
            *(float *)((long)local_338.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[1].m_data + lVar12 + lVar18)
                 = local_31c * local_2b8;
            *(float *)((long)local_338.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[1].m_data +
                      lVar18 + lVar12 + 4) = local_320 * local_2b8;
            *(undefined4 *)
             ((long)local_338.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[1].m_data + lVar18 + lVar12 + 8) = 0;
            *(float *)((long)local_338.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[1].m_data +
                      lVar18 + lVar12 + 0xc) = local_2b8;
            *(float *)((long)local_338.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[2].m_data + lVar12 + lVar18)
                 = local_318 * fVar26;
            *(float *)((long)local_338.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[2].m_data +
                      lVar18 + lVar12 + 4) = local_314 * fVar26;
            *(undefined4 *)
             ((long)local_338.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[2].m_data + lVar18 + lVar12 + 8) = 0;
            *(float *)((long)local_338.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[2].m_data +
                      lVar18 + lVar12 + 0xc) = fVar26;
            *(float *)((long)local_338.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[3].m_data + lVar12 + lVar18)
                 = local_318 * fVar26;
            *(float *)((long)local_338.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[3].m_data +
                      lVar18 + lVar12 + 4) = local_314 * fVar26;
            *(undefined4 *)
             ((long)local_338.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[3].m_data + lVar18 + lVar12 + 8) = 0;
            *(float *)((long)local_338.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[3].m_data +
                      lVar18 + lVar12 + 0xc) = fVar26;
            *(float *)((long)local_338.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[4].m_data + lVar12 + lVar18)
                 = local_310 * local_2b0;
            *(float *)((long)local_338.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[4].m_data +
                      lVar18 + lVar12 + 4) = fVar22 * local_2b0;
            *(undefined4 *)
             ((long)local_338.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[4].m_data + lVar18 + lVar12 + 8) = 0;
            *(float *)((long)local_338.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[4].m_data +
                      lVar18 + lVar12 + 0xc) = local_2b0;
            local_344 = local_344 * fVar20;
            local_340 = local_340 * fVar20;
LAB_0079f193:
            local_338.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar8 + 5].m_data[0] = local_344;
            local_338.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar8 + 5].m_data[1] = local_340;
            local_338.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar8 + 5].m_data[2] = 0.0;
            local_338.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar8 + 5].m_data[3] = fVar20;
          }
          else {
            if (FVar2 == FILLRULECASE_REVERSED) {
              lVar8 = (uVar17 | local_210) * 6;
              *(float *)((long)(local_338.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar18 + lVar12
                        ) = local_310;
              *(float *)((long)(local_338.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_data +
                        lVar18 + 4 + lVar12) = fVar22;
              *(undefined8 *)
               ((long)(local_338.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar18 + 8 + lVar12) =
                   0x3f80000000000000;
              *(float *)((long)local_338.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[1].m_data + lVar12 + lVar18
                        ) = local_31c;
              *(float *)((long)local_338.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[1].m_data +
                        lVar18 + lVar12 + 4) = local_320;
              *(undefined8 *)
               ((long)local_338.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[1].m_data + lVar18 + lVar12 + 8) =
                   0x3f80000000000000;
              *(float *)((long)local_338.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[2].m_data + lVar12 + lVar18
                        ) = local_318;
              *(float *)((long)local_338.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[2].m_data +
                        lVar18 + lVar12 + 4) = local_314;
              *(undefined8 *)
               ((long)local_338.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[2].m_data + lVar18 + lVar12 + 8) =
                   0x3f80000000000000;
              *(float *)((long)local_338.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[3].m_data + lVar12 + lVar18
                        ) = local_310;
              *(float *)((long)local_338.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[3].m_data +
                        lVar18 + lVar12 + 4) = fVar22;
              *(undefined8 *)
               ((long)local_338.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[3].m_data + lVar18 + lVar12 + 8) =
                   0x3f80000000000000;
              *(float *)((long)local_338.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[4].m_data + lVar12 + lVar18
                        ) = local_318;
              *(float *)((long)local_338.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[4].m_data +
                        lVar18 + lVar12 + 4) = local_314;
              *(undefined8 *)
               ((long)local_338.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[4].m_data + lVar18 + lVar12 + 8) =
                   0x3f80000000000000;
LAB_0079efcf:
              fVar20 = 1.0;
              goto LAB_0079f193;
            }
            if (FVar2 == FILLRULECASE_BASIC) {
              *(float *)((long)(local_338.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar18 + lVar12
                        ) = local_310;
              *(float *)((long)(local_338.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_data +
                        lVar18 + 4 + lVar12) = fVar22;
              *(undefined8 *)
               ((long)(local_338.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar18 + 8 + lVar12) =
                   0x3f80000000000000;
              *(float *)((long)local_338.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[1].m_data + lVar12 + lVar18
                        ) = local_31c;
              *(float *)((long)local_338.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[1].m_data +
                        lVar18 + lVar12 + 4) = local_320;
              *(undefined8 *)
               ((long)local_338.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[1].m_data + lVar18 + lVar12 + 8) =
                   0x3f80000000000000;
              *(float *)((long)local_338.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[2].m_data + lVar12 + lVar18
                        ) = local_318;
              *(float *)((long)local_338.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[2].m_data +
                        lVar18 + lVar12 + 4) = local_314;
              *(undefined8 *)
               ((long)local_338.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[2].m_data + lVar18 + lVar12 + 8) =
                   0x3f80000000000000;
              *(float *)((long)local_338.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[3].m_data + lVar12 + lVar18
                        ) = local_318;
              *(float *)((long)local_338.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[3].m_data +
                        lVar18 + lVar12 + 4) = local_314;
              *(undefined8 *)
               ((long)local_338.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[3].m_data + lVar18 + lVar12 + 8) =
                   0x3f80000000000000;
              *(float *)((long)local_338.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[4].m_data + lVar12 + lVar18
                        ) = local_310;
              *(float *)((long)local_338.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[4].m_data +
                        lVar18 + lVar12 + 4) = fVar22;
              *(undefined8 *)
               ((long)local_338.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[4].m_data + lVar18 + lVar12 + 8) =
                   0x3f80000000000000;
              lVar8 = lVar19;
              goto LAB_0079efcf;
            }
          }
          uVar17 = uVar17 + 1;
          lVar19 = lVar19 + 6;
          lVar18 = lVar18 + 0x60;
        } while (lVar18 != 0x180);
        lVar8 = local_1f8 + 1;
        lVar19 = local_1f0 + 0x18;
        lVar12 = lVar12 + 0x180;
        iVar11 = iVar11 + 4;
        this = local_2c0;
        __return_storage_ptr__ = local_200;
      } while (lVar8 != 4);
    }
  }
  local_1b8._0_8_ = (TestLog *)0x3f0000003f000000;
  local_1b8._8_8_ = 0x3f8000003f000000;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&local_2a8,
             (long)local_338.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_338.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4,(value_type *)local_1b8,
             (allocator_type *)&local_2e0);
  local_1b8._0_8_ =
       ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context)->m_testCtx->m_log;
  poVar1 = (ostringstream *)(local_1b8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,
             "Drawing gray triangles with shared edges.\nEnabling additive blending to detect overlapping fragments."
             ,0x65);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_140);
  BaseRenderingTestInstance::drawPrimitives
            (&this->super_BaseRenderingTestInstance,&local_248,&local_338,
             (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&local_2a8,
             VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8.m_name._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_2a8.m_name._M_dataplus._M_p,
                    local_2a8.m_name.field_2._M_allocated_capacity -
                    (long)local_2a8.m_name._M_dataplus._M_p);
  }
  local_1b8._0_8_ =
       ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context)->m_testCtx->m_log;
  poVar1 = (ostringstream *)(local_1b8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Verifying result.",0x11);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_140);
  if (local_248.m_height < 1) {
LAB_0079f5b5:
    local_1b8._0_8_ =
         ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1b8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"No overlapping fragments detected.",0x22);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_140);
  }
  else {
    iVar11 = 0;
    iVar13 = 0;
    bVar15 = false;
    do {
      uVar17 = (ulong)(uint)local_248.m_width;
      iVar16 = iVar11;
      if (0 < local_248.m_width) {
        do {
          uVar3 = *(uint *)((long)local_248.m_pixels.m_ptr + (long)iVar16 * 4);
          if (((local_30c < (int)((uVar3 & 0xff) - 0x7f)) ||
              (local_304 < (int)((uVar3 >> 8 & 0xff) - 0x7f))) ||
             (local_308 < (int)((uVar3 >> 0x10 & 0xff) - 0x7f))) {
            bVar15 = true;
          }
          iVar16 = iVar16 + 1;
          uVar17 = uVar17 - 1;
        } while (uVar17 != 0);
      }
      iVar13 = iVar13 + 1;
      iVar11 = iVar11 + local_248.m_width;
    } while (iVar13 != local_248.m_height);
    if (!bVar15) goto LAB_0079f5b5;
    local_1b8._0_8_ =
         ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1b8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Overlapping fragments detected, image is not valid.",0x33);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_140);
    this->m_allIterationsPassed = false;
  }
  if (this->m_caseType == FILLRULECASE_CLIPPED_FULL) {
    local_1b8._0_8_ =
         ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1b8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Searching missing fragments.",0x1c);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_140);
    if (0 < local_248.m_height) {
      iVar11 = 0;
      iVar13 = 0;
      bVar15 = false;
      do {
        uVar17 = (ulong)(uint)local_248.m_width;
        iVar16 = iVar11;
        if (0 < local_248.m_width) {
          do {
            uVar3 = *(uint *)((long)local_248.m_pixels.m_ptr + (long)iVar16 * 4);
            if ((((int)(uVar3 & 0xff) <= local_30c) || ((int)(uVar3 >> 8 & 0xff) <= local_304)) ||
               ((int)(uVar3 >> 0x10 & 0xff) <= local_308)) {
              bVar15 = true;
            }
            iVar16 = iVar16 + 1;
            uVar17 = uVar17 - 1;
          } while (uVar17 != 0);
        }
        iVar13 = iVar13 + 1;
        iVar11 = iVar11 + local_248.m_width;
      } while (iVar13 != local_248.m_height);
      if (bVar15) {
        local_1b8._0_8_ =
             ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context)->m_testCtx->
             m_log;
        poVar1 = (ostringstream *)(local_1b8 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Missing fragments detected, image is not valid.",0x2f);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_140);
        this->m_allIterationsPassed = false;
        goto LAB_0079f7d3;
      }
    }
    local_1b8._0_8_ =
         ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1b8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"No missing fragments detected.",0x1e);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_140);
  }
LAB_0079f7d3:
  pTVar4 = ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context)->m_testCtx->m_log;
  local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"Result of rendering","");
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"Result of rendering","");
  tcu::LogImageSet::LogImageSet(&local_2a8,&local_2e0,&local_268);
  tcu::TestLog::startImageSet
            (pTVar4,local_2a8.m_name._M_dataplus._M_p,local_2a8.m_description._M_dataplus._M_p);
  local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"Result","");
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"Result","");
  surface = &local_248;
  tcu::LogImage::LogImage
            ((LogImage *)local_1b8,&local_300,&local_1d8,surface,QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write((LogImage *)local_1b8,(int)pTVar4,__buf,(size_t)surface);
  tcu::TestLog::endImageSet(pTVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_p != local_188) {
    operator_delete(local_198._M_p,local_188[0]._M_allocated_capacity + 1);
  }
  pTVar4 = (TestLog *)(local_1b8 + 0x10);
  if ((TestLog *)local_1b8._0_8_ != pTVar4) {
    operator_delete((void *)local_1b8._0_8_,local_1a8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  pFVar5 = local_2c0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != &local_300.field_2) {
    operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8.m_description._M_dataplus._M_p != &local_2a8.m_description.field_2) {
    operator_delete(local_2a8.m_description._M_dataplus._M_p,
                    local_2a8.m_description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8.m_name._M_dataplus._M_p != &local_2a8.m_name.field_2) {
    operator_delete(local_2a8.m_name._M_dataplus._M_p,
                    local_2a8.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
  }
  iVar11 = pFVar5->m_iteration + 1;
  pFVar5->m_iteration = iVar11;
  if (iVar11 == pFVar5->m_iterationCount) {
    local_1b8._0_8_ = pTVar4;
    if (pFVar5->m_allIterationsPassed == true) {
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"Pass","");
      __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
      (__return_storage_ptr__->m_description)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->m_description,local_1b8._0_8_,
                 (pointer)(local_1b8._0_8_ + local_1b8._8_8_));
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"Found invalid pixels","")
      ;
      __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
      (__return_storage_ptr__->m_description)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->m_description,local_1b8._0_8_,
                 (pointer)(local_1b8._0_8_ + local_1b8._8_8_));
    }
    if ((TestLog *)local_1b8._0_8_ != pTVar4) {
      operator_delete((void *)local_1b8._0_8_,local_1a8._M_allocated_capacity + 1);
    }
  }
  else {
    tcu::TestStatus::incomplete();
  }
  if (local_338.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_338.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_338.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_338.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  tcu::Surface::~Surface(&local_248);
  tcu::TestLog::endSection(local_208.m_log);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus FillRuleTestInstance::iterate (void)
{
	const std::string						iterationDescription	= "Test iteration " + de::toString(m_iteration+1) + " / " + de::toString(m_iterationCount);
	const tcu::ScopedLogSection				section					(m_context.getTestContext().getLog(), iterationDescription, iterationDescription);
	tcu::IVec4								colorBits				= tcu::getTextureFormatBitDepth(getTextureFormat());
	const int								thresholdRed			= 1 << (8 - colorBits[0]);
	const int								thresholdGreen			= 1 << (8 - colorBits[1]);
	const int								thresholdBlue			= 1 << (8 - colorBits[2]);
	tcu::Surface							resultImage				(m_renderSize, m_renderSize);
	std::vector<tcu::Vec4>					drawBuffer;

	generateTriangles(m_iteration, drawBuffer);

	// draw image
	{
		const std::vector<tcu::Vec4>	colorBuffer		(drawBuffer.size(), tcu::Vec4(0.5f, 0.5f, 0.5f, 1.0f));

		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Drawing gray triangles with shared edges.\nEnabling additive blending to detect overlapping fragments." << tcu::TestLog::EndMessage;

		drawPrimitives(resultImage, drawBuffer, colorBuffer, VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST);
	}

	// verify no overdraw
	{
		const tcu::RGBA	triangleColor	= tcu::RGBA(127, 127, 127, 255);
		bool			overdraw		= false;

		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Verifying result." << tcu::TestLog::EndMessage;

		for (int y = 0; y < resultImage.getHeight(); ++y)
		for (int x = 0; x < resultImage.getWidth();  ++x)
		{
			const tcu::RGBA color = resultImage.getPixel(x, y);

			// color values are greater than triangle color? Allow lower values for multisampled edges and background.
			if ((color.getRed()   - triangleColor.getRed())   > thresholdRed   ||
				(color.getGreen() - triangleColor.getGreen()) > thresholdGreen ||
				(color.getBlue()  - triangleColor.getBlue())  > thresholdBlue)
				overdraw = true;
		}

		// results
		if (!overdraw)
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "No overlapping fragments detected." << tcu::TestLog::EndMessage;
		else
		{
			m_context.getTestContext().getLog()	<< tcu::TestLog::Message << "Overlapping fragments detected, image is not valid." << tcu::TestLog::EndMessage;
			m_allIterationsPassed = false;
		}
	}

	// verify no missing fragments in the full viewport case
	if (m_caseType == FILLRULECASE_CLIPPED_FULL)
	{
		bool missingFragments = false;

		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Searching missing fragments." << tcu::TestLog::EndMessage;

		for (int y = 0; y < resultImage.getHeight(); ++y)
		for (int x = 0; x < resultImage.getWidth();  ++x)
		{
			const tcu::RGBA color = resultImage.getPixel(x, y);

			// black? (background)
			if (color.getRed()   <= thresholdRed   ||
				color.getGreen() <= thresholdGreen ||
				color.getBlue()  <= thresholdBlue)
				missingFragments = true;
		}

		// results
		if (!missingFragments)
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "No missing fragments detected." << tcu::TestLog::EndMessage;
		else
		{
			m_context.getTestContext().getLog()	<< tcu::TestLog::Message << "Missing fragments detected, image is not valid." << tcu::TestLog::EndMessage;

			m_allIterationsPassed = false;
		}
	}

	m_context.getTestContext().getLog()	<< tcu::TestLog::ImageSet("Result of rendering", "Result of rendering")
										<< tcu::TestLog::Image("Result", "Result", resultImage)
										<< tcu::TestLog::EndImageSet;

	// result
	if (++m_iteration == m_iterationCount)
	{
		if (m_allIterationsPassed)
			return tcu::TestStatus::pass("Pass");
		else
			return tcu::TestStatus::fail("Found invalid pixels");
	}
	else
		return tcu::TestStatus::incomplete();
}